

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  string *s;
  pointer pbVar5;
  bool bVar6;
  bool fix;
  double z;
  double y;
  double x;
  double w;
  double v;
  double u;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  non_option_args;
  double gamma;
  double beta;
  double alpha;
  double c;
  double b;
  double a;
  string output_xyz;
  shared_ptr<CIF::Reader> cif;
  string input_cif;
  undefined1 local_6b8 [32];
  double dStack_698;
  double local_690;
  double local_688;
  double dStack_680;
  double local_678;
  double local_670;
  double dStack_668;
  double local_660;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string file;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  stringstream ss;
  ostream local_4e8 [376];
  Reader local_370;
  ifstream test_stream;
  streambuf local_290 [504];
  SuperCellInfo local_98;
  
  verbose_flag = 0;
  std::__cxx11::string::string((string *)&output_xyz,"",(allocator *)&test_stream);
  std::__cxx11::string::string((string *)&input_cif,"",(allocator *)&test_stream);
  gamma = 0.0;
  beta = 0.0;
  alpha = 0.0;
  z = 0.0;
  y = 0.0;
  x = 0.0;
  c = 0.0;
  b = 0.0;
  a = 0.0;
  w = 0.0;
  v = 0.0;
  u = 0.0;
LAB_00136c85:
  _test_stream = 0;
  iVar2 = getopt_long(argc,argv,"fhvz:d:o:n:t:",main::long_options,&test_stream);
  switch(iVar2) {
  case 100:
    std::__cxx11::string::string((string *)&local_578,_optarg,(allocator *)&ss);
    parseThreeCommaList<double>(&local_578,&x,&y,&z);
    std::__cxx11::string::~string((string *)&local_578);
    goto LAB_00136c85;
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
switchD_00136d18_caseD_65:
    iVar2 = 1;
    break;
  case 0x66:
    goto LAB_00136c85;
  case 0x68:
    printHelp();
    goto LAB_00137079;
  case 0x6e:
    std::__cxx11::string::string((string *)&local_538,_optarg,(allocator *)&ss);
    parseThreeCommaList<double>(&local_538,&a,&b,&c);
    std::__cxx11::string::~string((string *)&local_538);
    goto LAB_00136c85;
  case 0x6f:
    std::__cxx11::string::assign((char *)&output_xyz);
    goto LAB_00136c85;
  default:
    goto switchD_00136d18_default;
  }
  goto LAB_00137642;
switchD_00136d18_default:
  if ((iVar2 == 0) || (iVar2 == 0x3f)) goto LAB_00136c85;
  if (iVar2 == 0x74) {
    std::__cxx11::string::string((string *)&local_558,_optarg,(allocator *)&ss);
    parseThreeCommaList<double>(&local_558,&alpha,&beta,&gamma);
    std::__cxx11::string::~string((string *)&local_558);
    goto LAB_00136c85;
  }
  if (iVar2 == 0x7a) {
    std::__cxx11::string::string((string *)&local_518,_optarg,(allocator *)&ss);
    parseThreeCommaList<double>(&local_518,&u,&v,&w);
    std::__cxx11::string::~string((string *)&local_518);
    goto LAB_00136c85;
  }
  if (iVar2 != -1) {
    if (iVar2 == 0x76) {
      printVersion();
LAB_00137079:
      iVar2 = 0;
      goto LAB_00137642;
    }
    goto switchD_00136d18_caseD_65;
  }
  non_option_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  non_option_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  non_option_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (lVar3 = (long)_optind, _optind < argc) {
    _optind = _optind + 1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&non_option_args
               ,argv + lVar3);
  }
  bVar6 = non_option_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          non_option_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (bVar6) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error: Need one non-option argument (the input .cif)");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bVar6 = !bVar6;
  if (0x20 < (ulong)((long)non_option_args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)non_option_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error: Only expecting one non-option argument (the input .cif). Instead got:"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    pbVar1 = non_option_args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = non_option_args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      poVar4 = std::operator<<((ostream *)&std::cerr,"\t");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    bVar6 = false;
  }
  if ((long)non_option_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)non_option_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    std::__cxx11::string::_M_assign((string *)&input_cif);
  }
  if (((((u == 0.0) && (!NAN(u))) && (v == 0.0)) && ((!NAN(v) && (w == 0.0)))) && (!NAN(w))) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Did not get valid zone axis");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  if (((x <= 0.0) || (y <= 0.0)) || (z <= 0.0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Error: Did not get valid superstructure dimensions");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar6 = false;
  }
  std::ifstream::ifstream(&test_stream,(string *)&input_cif,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ostream::operator<<(local_4e8,local_290);
  std::ifstream::close();
  std::__cxx11::stringbuf::str();
  if (file._M_string_length == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Invalid input .cif file");
    std::endl<char,std::char_traits<char>>(poVar4);
LAB_0013760e:
    iVar2 = 1;
  }
  else {
    if (!bVar6) goto LAB_0013760e;
    if (output_xyz._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&output_xyz);
      std::__cxx11::string::string((string *)&local_5b8,(string *)&output_xyz);
      std::__cxx11::string::string((string *)&local_5d8,".cif",(allocator *)local_6b8);
      bVar6 = endsWith(&local_5b8,&local_5d8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::__cxx11::string::~string((string *)&local_5b8);
      if (bVar6) {
        std::__cxx11::string::string((string *)&local_5f8,(string *)&output_xyz);
        removeEnd((string *)&cif,&local_5f8,4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cif,
                       ".xyz");
        std::__cxx11::string::operator=((string *)&output_xyz,(string *)local_6b8);
        std::__cxx11::string::~string((string *)local_6b8);
        std::__cxx11::string::~string((string *)&cif);
        std::__cxx11::string::~string((string *)&local_5f8);
      }
    }
    std::__cxx11::string::string((string *)&local_618,(string *)&output_xyz);
    std::__cxx11::string::string((string *)&local_638,".xyz",(allocator *)local_6b8);
    bVar6 = endsWith(&local_618,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&local_618);
    if (!bVar6) {
      std::__cxx11::string::append((char *)&output_xyz);
    }
    if (verbose_flag != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Verbose flag is set");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::make_shared<CIF::Reader,std::__cxx11::string&,bool&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,
               (bool *)&input_cif);
    std::__shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2> *)local_6b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6b8 + 8));
    local_6b8._0_8_ = (pointer)0x0;
    local_6b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_6b8._16_8_ = 0x3ff0000000000000;
    local_690 = 0.0;
    local_6b8._24_8_ = 0;
    dStack_698 = 0.0;
    local_688 = 100.0;
    dStack_680 = 100.0;
    local_678 = 100.0;
    local_660 = 0.0;
    local_670 = 0.0;
    dStack_668 = 0.0;
    CIF::SuperCellInfo::setUVW((SuperCellInfo *)local_6b8,u,v,w);
    CIF::SuperCellInfo::setABC((SuperCellInfo *)local_6b8,a,b,c);
    CIF::SuperCellInfo::setWidths((SuperCellInfo *)local_6b8,x,y,z);
    CIF::SuperCellInfo::setTilts((SuperCellInfo *)local_6b8,alpha,beta,gamma);
    CIF::Reader::Reader(&local_370,
                        cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::string((string *)&local_658,(string *)&output_xyz);
    local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = (double)local_6b8._16_8_;
    local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = (double)local_6b8._0_8_;
    local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = (double)local_6b8._8_8_;
    local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = local_690;
    local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = (double)local_6b8._24_8_;
    local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = dStack_698;
    local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = local_688;
    local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_680;
    local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_678;
    local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = local_670;
    local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_668;
    local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_660;
    makeXYZ(&local_370,&local_658,&local_98);
    std::__cxx11::string::~string((string *)&local_658);
    CIF::Reader::~Reader(&local_370);
    iVar2 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cif.super___shared_ptr<CIF::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ifstream::~ifstream(&test_stream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&non_option_args);
LAB_00137642:
  std::__cxx11::string::~string((string *)&input_cif);
  std::__cxx11::string::~string((string *)&output_xyz);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    verbose_flag = 0; // set the here to be 100% that it is zero
    bool fix = false;
    int cc;

    std::string output_xyz = "";
    std::string input_cif = "";
    double u, v, w, a, b, c, x, y, z, alpha, beta, gamma;
    u = v = w = a = b = c = x = y = z = alpha = beta  = gamma = 0;

    bool valid = true;

    while (true)
    {
        static struct option long_options[] =
                {
                        {"help",       no_argument,       nullptr,       'h'},
                        {"version",    no_argument,       nullptr,       'v'},
                        {"zone",       required_argument, nullptr,       'z'},
                        {"dimensions", required_argument, nullptr,       'd'},
                        {"output",     optional_argument, nullptr,       'o'},
                        {"normal",     optional_argument, nullptr,       'n'},
                        {"tilt",       optional_argument, nullptr,       't'},
                        {"fix",       no_argument, nullptr,       'f'},
                        {"verbose",    no_argument,       &verbose_flag, 1},
                        {nullptr,      0,                 nullptr,       0}
                };
        // getopt_long stores the option index here.
        int option_index = 0;
        cc = getopt_long (argc, argv, "fhvz:d:o:n:t:", long_options, &option_index);

        // Detect the end of the options.
        if (cc == -1)
            break;

        switch (cc)
        {
            case 0:
                break;
            case 'h':
                printHelp();
                return 0;
            case 'v':
                printVersion();
                return 0;
            case 'o':
                output_xyz = optarg;
                break;
            case 'z':
                try {
                    parseThreeCommaList<double>(optarg, u, v, w);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse zone axis:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'n':
                try {
                    parseThreeCommaList<double>(optarg, a, b, c);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse normal vector:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 't':
                try {
                    parseThreeCommaList<double>(optarg, alpha, beta, gamma);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse tilt angles:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'd':
                try {
                    parseThreeCommaList<double>(optarg, x, y, z);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse superstructure dimensions:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'f':
                fix = true;
                break;
            case '?':
                // getopt_long already printed an error message.
                break;

            default:
                return 1;
        }
    }

    // do the input file (it's the only non option arg)

    // get the non option args
    std::vector<std::string> non_option_args;
    while (optind < argc)
        non_option_args.emplace_back(argv[optind++]);

    if (non_option_args.size() < 1) {
        std::cerr << "Error: Need one non-option argument (the input .cif)" << std::endl;
        valid = false;
    }


    if (non_option_args.size() > 1) {
        std::cerr << "Error: Only expecting one non-option argument (the input .cif). Instead got:" << std::endl;
        for (std::string& s : non_option_args)
            std::cerr << "\t" << s << std::endl;
        valid = false;
    }

    // this is where the input is actually set
    if (non_option_args.size() == 1)
        input_cif = non_option_args[0];

    if (u == 0 && v == 0 && w == 0)  {
        std::cerr << "Error: Did not get valid zone axis" << std::endl;
        valid = false;
    }

    if (x <= 0 || y <= 0 || z <= 0)  {
        std::cerr << "Error: Did not get valid superstructure dimensions" << std::endl;
        valid = false;
    }

    std::ifstream test_stream(input_cif);

    std::stringstream ss;
    ss << test_stream.rdbuf();
    test_stream.close();
    std::string file = ss.str();

    if (file.empty()) {
        std::cerr << "Error: Invalid input .cif file" << std::endl;
        valid = false;
    }

    if (!valid)
        return 1;
    // we now have everything we need in some form. Need to verify the file/directory now.s

    // output file:
    // if we were not give an output file, use the input file (but change the extension)
    if (output_xyz.empty())
    {
        output_xyz = input_cif;
        if (endsWith(output_xyz, ".cif"))
            output_xyz = removeEnd(output_xyz, 4) + ".xyz";
    }

    // else just go with it, but append xyz if it doesnt have it already.
    if (!endsWith(output_xyz, ".xyz"))
        output_xyz += ".xyz";


    if (verbose_flag) {
        std::cout << "Verbose flag is set" << std::endl << std::endl;
    }

    std::shared_ptr<CIF::Reader> cif;

    try {
        cif = std::make_shared<CIF::Reader>(input_cif, fix);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not read cif file:\n\t" << ex.what() << std::endl;
        return 1;
    }

    CIF::SuperCellInfo si;
    si.setUVW(u, v, w);
    si.setABC(a, b, c);
    si.setWidths(x, y, z);
    si.setTilts(alpha, beta, gamma);

    try {
        makeXYZ(*cif, output_xyz, si);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not create superstructure:\n\t" << ex.what() << std::endl;
        return 1;
    }

    return 0;
}